

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O3

CURLcode Curl_retry_request(connectdata *conn,char **url)

{
  Curl_easy *pCVar1;
  CURLcode CVar2;
  char *pcVar3;
  CURLcode CVar4;
  
  pCVar1 = conn->data;
  *url = (char *)0x0;
  if (((pCVar1->set).upload == true) && ((conn->handler->protocol & 0x40003) == 0)) {
    CVar2 = CURLE_OK;
  }
  else {
    CVar4 = CURLE_OK;
    CVar2 = CURLE_OK;
    if (((((pCVar1->req).bytecount + (pCVar1->req).headerbytecount == 0) &&
         (CVar2 = CVar4, (conn->bits).reuse == true)) &&
        (((pCVar1->set).opt_no_body != true || ((conn->handler->protocol & 3) != 0)))) &&
       ((pCVar1->set).rtspreq != RTSPREQ_RECEIVE)) {
      CVar2 = CURLE_OK;
      Curl_infof(conn->data,"Connection died, retrying a fresh connect\n");
      pcVar3 = (*Curl_cstrdup)((conn->data->change).url);
      *url = pcVar3;
      if (pcVar3 == (char *)0x0) {
        CVar2 = CURLE_OUT_OF_MEMORY;
      }
      else {
        Curl_conncontrol(conn,1);
        (conn->bits).retry = true;
        if (((conn->handler->protocol & 3) != 0) &&
           (*(long *)((long)(pCVar1->req).protop + 0x30) != 0)) {
          CVar2 = Curl_readrewind(conn);
          return CVar2;
        }
      }
    }
  }
  return CVar2;
}

Assistant:

CURLcode Curl_retry_request(struct connectdata *conn,
                            char **url)
{
  struct Curl_easy *data = conn->data;

  *url = NULL;

  /* if we're talking upload, we can't do the checks below, unless the protocol
     is HTTP as when uploading over HTTP we will still get a response */
  if(data->set.upload &&
     !(conn->handler->protocol&(PROTO_FAMILY_HTTP|CURLPROTO_RTSP)))
    return CURLE_OK;

  if((data->req.bytecount + data->req.headerbytecount == 0) &&
      conn->bits.reuse &&
      (!data->set.opt_no_body
        || (conn->handler->protocol & PROTO_FAMILY_HTTP)) &&
      (data->set.rtspreq != RTSPREQ_RECEIVE)) {
    /* We got no data, we attempted to re-use a connection. For HTTP this
       can be a retry so we try again regardless if we expected a body.
       For other protocols we only try again only if we expected a body.

       This might happen if the connection was left alive when we were
       done using it before, but that was closed when we wanted to read from
       it again. Bad luck. Retry the same request on a fresh connect! */
    infof(conn->data, "Connection died, retrying a fresh connect\n");
    *url = strdup(conn->data->change.url);
    if(!*url)
      return CURLE_OUT_OF_MEMORY;

    connclose(conn, "retry"); /* close this connection */
    conn->bits.retry = TRUE; /* mark this as a connection we're about
                                to retry. Marking it this way should
                                prevent i.e HTTP transfers to return
                                error just because nothing has been
                                transferred! */


    if(conn->handler->protocol&PROTO_FAMILY_HTTP) {
      struct HTTP *http = data->req.protop;
      if(http->writebytecount)
        return Curl_readrewind(conn);
    }
  }
  return CURLE_OK;
}